

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

void __thiscall cmMakefile::Configure(cmMakefile *this)

{
  cmStateSnapshot *this_00;
  cmListFileBacktrace *file;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  cmake *this_02;
  cmListFileFunction *pcVar4;
  cmListFileFunction *pcVar5;
  cmListFileFunction *pcVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  pointer pcVar9;
  bool bVar10;
  int iVar11;
  string *psVar12;
  iterator iVar13;
  element_type *peVar14;
  cmListFileFunction *func;
  pointer __k;
  vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> subdirs;
  string currentStart;
  string filesDir;
  cmListFile listFile;
  BuildsystemFileScope scope;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  undefined1 local_168 [16];
  undefined1 local_158 [32];
  cmLinkedTree<cmStateDetail::SnapshotDataType> local_138;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_108;
  pointer pcStack_100;
  pointer local_f8;
  int local_ec;
  string local_e8;
  string local_c8;
  cmListFile local_a8;
  BuildsystemFileScope local_68;
  
  this_00 = &this->StateSnapshot;
  cmStateSnapshot::GetDirectory((cmStateDirectory *)local_168,this_00);
  psVar12 = cmStateDirectory::GetCurrentSource_abi_cxx11_((cmStateDirectory *)local_168);
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  pcVar3 = (psVar12->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e8,pcVar3,pcVar3 + psVar12->_M_string_length);
  std::__cxx11::string::append((char *)&local_e8);
  file = &this->Backtrace;
  cmListFileBacktrace::Push((cmListFileBacktrace *)local_168,(string *)file);
  uVar8 = local_168._8_8_;
  uVar7 = local_168._0_8_;
  local_168._0_8_ = (element_type *)0x0;
  local_168._8_8_ = (element_type *)0x0;
  this_01 = (this->Backtrace).TopEntry.
            super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->Backtrace).TopEntry.
  super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)uVar7;
  (this->Backtrace).TopEntry.
  super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar8;
  if ((this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
     (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01),
     (element_type *)local_168._8_8_ != (element_type *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_);
  }
  BuildsystemFileScope::BuildsystemFileScope(&local_68,this);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)local_168,this_00);
  psVar12 = cmStateDirectory::GetCurrentBinary_abi_cxx11_((cmStateDirectory *)local_168);
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  pcVar3 = (psVar12->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c8,pcVar3,pcVar3 + psVar12->_M_string_length);
  std::__cxx11::string::append((char *)&local_c8);
  cmsys::SystemTools::MakeDirectory(&local_c8,(mode_t *)0x0);
  bVar10 = cmsys::SystemTools::FileExists(&local_e8,true);
  if (!bVar10) {
    __assert_fail("cmSystemTools::FileExists(currentStart, true)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmMakefile.cxx"
                  ,0x606,"void cmMakefile::Configure()");
  }
  local_168._0_8_ = (element_type *)local_158;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"CMAKE_PARENT_LIST_FILE","");
  AddDefinition(this,(string *)local_168,local_e8._M_dataplus._M_p);
  if ((element_type *)local_168._0_8_ != (element_type *)local_158) {
    operator_delete((void *)local_168._0_8_,
                    (ulong)&(((map<cmProperty::ScopeType,_cmPropertyDefinitionMap,_std::less<cmProperty::ScopeType>,_std::allocator<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>_>
                               *)local_158._0_8_)->_M_t)._M_impl.field_0x1);
  }
  paVar2 = &local_a8.Filename.field_2;
  local_a8.Functions.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.Functions.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
  _M_impl.super__Vector_impl_data._M_start = (cmListFileFunction *)0x0;
  local_a8.Functions.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
  _M_impl.super__Vector_impl_data._M_finish = (cmListFileFunction *)0x0;
  local_a8.Filename._M_string_length = 0;
  local_a8.Filename.field_2._M_local_buf[0] = '\0';
  local_a8.Filename._M_dataplus._M_p = (pointer)paVar2;
  bVar10 = cmListFile::ParseFile
                     (&local_a8,local_e8._M_dataplus._M_p,
                      (this->GlobalGenerator->CMakeInstance->Messenger)._M_t.
                      super___uniq_ptr_impl<cmMessenger,_std::default_delete<cmMessenger>_>._M_t.
                      super__Tuple_impl<0UL,_cmMessenger_*,_std::default_delete<cmMessenger>_>.
                      super__Head_base<0UL,_cmMessenger_*,_false>._M_head_impl,file);
  if (!bVar10) goto LAB_001cbb2b;
  cmStateSnapshot::GetBuildsystemDirectoryParent((cmStateSnapshot *)local_168,this_00);
  bVar10 = cmStateSnapshot::IsValid((cmStateSnapshot *)local_168);
  pcVar9 = local_a8.Functions.
           super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pcVar4 = local_a8.Functions.
           super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (!bVar10) {
    for (; pcVar4 != pcVar9; pcVar4 = pcVar4 + 1) {
      iVar11 = std::__cxx11::string::compare((char *)pcVar4);
      pcVar5 = local_a8.Functions.
               super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
               super__Vector_impl_data._M_start;
      pcVar6 = local_a8.Functions.
               super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (iVar11 == 0) goto joined_r0x001cb918;
    }
    if ((ulong)(((long)local_a8.Functions.
                       super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_a8.Functions.
                       super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 3) * -0x1111111111111111) < 0x1e)
    {
      local_158._8_8_ = local_168 + 8;
      local_168._8_8_ = local_168._8_8_ & 0xffffffff00000000;
      local_158._0_8_ = (cmState *)0x0;
      local_158._24_8_ = 0;
      paVar1 = &local_188.field_2;
      local_188._M_dataplus._M_p = (pointer)paVar1;
      local_158._16_8_ = local_158._8_8_;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"project","");
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)local_168,&local_188);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != paVar1) {
        operator_delete(local_188._M_dataplus._M_p,
                        CONCAT71(local_188.field_2._M_allocated_capacity._1_7_,
                                 local_188.field_2._M_local_buf[0]) + 1);
      }
      local_188._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"set","");
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)local_168,&local_188);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != paVar1) {
        operator_delete(local_188._M_dataplus._M_p,
                        CONCAT71(local_188.field_2._M_allocated_capacity._1_7_,
                                 local_188.field_2._M_local_buf[0]) + 1);
      }
      local_188._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"if","");
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)local_168,&local_188);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != paVar1) {
        operator_delete(local_188._M_dataplus._M_p,
                        CONCAT71(local_188.field_2._M_allocated_capacity._1_7_,
                                 local_188.field_2._M_local_buf[0]) + 1);
      }
      local_188._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"endif","");
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)local_168,&local_188);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != paVar1) {
        operator_delete(local_188._M_dataplus._M_p,
                        CONCAT71(local_188.field_2._M_allocated_capacity._1_7_,
                                 local_188.field_2._M_local_buf[0]) + 1);
      }
      local_188._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"else","");
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)local_168,&local_188);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != paVar1) {
        operator_delete(local_188._M_dataplus._M_p,
                        CONCAT71(local_188.field_2._M_allocated_capacity._1_7_,
                                 local_188.field_2._M_local_buf[0]) + 1);
      }
      local_188._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"elseif","");
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)local_168,&local_188);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != paVar1) {
        operator_delete(local_188._M_dataplus._M_p,
                        CONCAT71(local_188.field_2._M_allocated_capacity._1_7_,
                                 local_188.field_2._M_local_buf[0]) + 1);
      }
      local_188._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"add_executable","");
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)local_168,&local_188);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != paVar1) {
        operator_delete(local_188._M_dataplus._M_p,
                        CONCAT71(local_188.field_2._M_allocated_capacity._1_7_,
                                 local_188.field_2._M_local_buf[0]) + 1);
      }
      local_188._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"add_library","");
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)local_168,&local_188);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != paVar1) {
        operator_delete(local_188._M_dataplus._M_p,
                        CONCAT71(local_188.field_2._M_allocated_capacity._1_7_,
                                 local_188.field_2._M_local_buf[0]) + 1);
      }
      local_188._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_188,"target_link_libraries","");
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)local_168,&local_188);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != paVar1) {
        operator_delete(local_188._M_dataplus._M_p,
                        CONCAT71(local_188.field_2._M_allocated_capacity._1_7_,
                                 local_188.field_2._M_local_buf[0]) + 1);
      }
      local_188._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"option","");
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)local_168,&local_188);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != paVar1) {
        operator_delete(local_188._M_dataplus._M_p,
                        CONCAT71(local_188.field_2._M_allocated_capacity._1_7_,
                                 local_188.field_2._M_local_buf[0]) + 1);
      }
      local_188._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"message","");
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)local_168,&local_188);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != paVar1) {
        operator_delete(local_188._M_dataplus._M_p,
                        CONCAT71(local_188.field_2._M_allocated_capacity._1_7_,
                                 local_188.field_2._M_local_buf[0]) + 1);
      }
      pcVar9 = local_a8.Functions.
               super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (local_a8.Functions.
          super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_a8.Functions.
          super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        __k = local_a8.Functions.
              super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
              super__Vector_impl_data._M_start;
        do {
          iVar13 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_168,(key_type *)__k);
          if (iVar13._M_node == (_Base_ptr)(local_168 + 8)) {
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_168);
            goto LAB_001cb887;
          }
          __k = __k + 1;
        } while (__k != pcVar9);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_168);
      pcVar5 = local_a8.Functions.
               super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
               super__Vector_impl_data._M_start;
      pcVar6 = local_a8.Functions.
               super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
               super__Vector_impl_data._M_finish;
    }
    else {
LAB_001cb887:
      this->CheckCMP0000 = true;
      local_168._0_8_ = local_158;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"2.4","");
      local_188._M_string_length = 0;
      local_188.field_2._M_local_buf[0] = '\0';
      local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
      cmPolicies::ApplyPolicyVersion(this,(string *)local_168,&local_188);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != &local_188.field_2) {
        operator_delete(local_188._M_dataplus._M_p,
                        CONCAT71(local_188.field_2._M_allocated_capacity._1_7_,
                                 local_188.field_2._M_local_buf[0]) + 1);
      }
      pcVar5 = local_a8.Functions.
               super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
               super__Vector_impl_data._M_start;
      pcVar6 = local_a8.Functions.
               super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if ((element_type *)local_168._0_8_ != (element_type *)local_158) {
        operator_delete((void *)local_168._0_8_,
                        (ulong)&(((map<cmProperty::ScopeType,_cmPropertyDefinitionMap,_std::less<cmProperty::ScopeType>,_std::allocator<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>_>
                                   *)local_158._0_8_)->_M_t)._M_impl.field_0x1);
        pcVar5 = local_a8.Functions.
                 super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl
                 .super__Vector_impl_data._M_start;
        pcVar6 = local_a8.Functions.
                 super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl
                 .super__Vector_impl_data._M_finish;
      }
    }
joined_r0x001cb918:
    do {
      pcVar9 = local_a8.Functions.
               super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (pcVar5 == local_a8.Functions.
                    super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                    _M_impl.super__Vector_impl_data._M_finish) goto LAB_001cb93d;
      local_a8.Functions.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
      ._M_impl.super__Vector_impl_data._M_finish = pcVar6;
      iVar11 = std::__cxx11::string::compare((char *)pcVar5);
      if (iVar11 == 0) break;
      pcVar5 = pcVar5 + 1;
      pcVar6 = local_a8.Functions.
               super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
               super__Vector_impl_data._M_finish;
      local_a8.Functions.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
      ._M_impl.super__Vector_impl_data._M_finish = pcVar9;
    } while( true );
  }
LAB_001cba83:
  ReadListFile(this,&local_a8,&local_e8);
  if ((cmSystemTools::s_FatalErrorOccured != false) ||
     (bVar10 = cmSystemTools::GetInterruptFlag(), bVar10)) {
    local_68.ReportError = false;
  }
  std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::vector
            ((vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> *)local_168,
             &this->UnConfiguredDirectories);
  peVar14 = (element_type *)local_168._0_8_;
  if (local_168._0_8_ != local_168._8_8_) {
    do {
      cmStateSnapshot::InitializeFromParent_ForSubdirsCommand
                ((cmStateSnapshot *)
                 ((long)&(((_Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
                            *)&(peVar14->field_0).Bottom.State)->_M_impl).super__Vector_impl_data.
                         _M_start[1].CompileDefinitions.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 + 8));
      ConfigureSubDirectory
                (this,(cmMakefile *)
                      (((_Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
                         *)&(peVar14->field_0).Bottom.State)->_M_impl).super__Vector_impl_data.
                      _M_start);
      peVar14 = (element_type *)&(peVar14->field_0).Bottom.Position;
    } while (peVar14 != (element_type *)local_168._8_8_);
  }
  AddCMakeDependFilesFromUser(this);
  if ((element_type *)local_168._0_8_ != (element_type *)0x0) {
    operator_delete((void *)local_168._0_8_,local_158._0_8_ - local_168._0_8_);
  }
LAB_001cbb2b:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.Filename._M_dataplus._M_p != paVar2) {
    operator_delete(local_a8.Filename._M_dataplus._M_p,
                    CONCAT71(local_a8.Filename.field_2._M_allocated_capacity._1_7_,
                             local_a8.Filename.field_2._M_local_buf[0]) + 1);
  }
  std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::~vector(&local_a8.Functions)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  BuildsystemFileScope::~BuildsystemFileScope(&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  return;
LAB_001cb93d:
  this_02 = this->GlobalGenerator->CMakeInstance;
  local_168._0_8_ = local_158;
  local_a8.Functions.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
  _M_impl.super__Vector_impl_data._M_finish = pcVar6;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_168,
             "No project() command is present.  The top-level CMakeLists.txt file must contain a literal, direct call to the project() command.  Add a line of code such as\n  project(ProjectName)\nnear the top of the file, but after cmake_minimum_required().\nCMake is pretending there is a \"project(Project)\" command on the first line."
             ,"");
  cmake::IssueMessage(this_02,AUTHOR_WARNING,(string *)local_168,file);
  if ((element_type *)local_168._0_8_ != (element_type *)local_158) {
    operator_delete((void *)local_168._0_8_,
                    (ulong)&(((map<cmProperty::ScopeType,_cmPropertyDefinitionMap,_std::less<cmProperty::ScopeType>,_std::allocator<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>_>
                               *)local_158._0_8_)->_M_t)._M_impl.field_0x1);
  }
  local_168._0_8_ = local_158;
  local_168._8_8_ = (element_type *)0x0;
  local_158._0_8_ = local_158._0_8_ & 0xffffffffffffff00;
  local_158._24_8_ = 0;
  local_138.Data.
  super__Vector_base<cmStateDetail::SnapshotDataType,_std::allocator<cmStateDetail::SnapshotDataType>_>
  ._M_impl.super__Vector_impl_data._M_start._0_1_ = '\0';
  local_138.Data.
  super__Vector_base<cmStateDetail::SnapshotDataType,_std::allocator<cmStateDetail::SnapshotDataType>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_138.UpPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.UpPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138.UpPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_108._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pcStack_100 = (pointer)0x0;
  local_f8 = (pointer)0x0;
  local_158._16_8_ = &local_138;
  std::__cxx11::string::_M_replace((ulong)local_168,0,(char *)0x0,0x547f1e);
  local_188._M_dataplus._M_p = local_188._M_dataplus._M_p & 0xffffffff00000000;
  local_ec = 0;
  std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>::
  emplace_back<char_const(&)[8],cmListFileArgument::Delimiter,int>
            ((vector<cmListFileArgument,std::allocator<cmListFileArgument>> *)&local_108,
             (char (*) [8])0x55e907,(Delimiter *)&local_188,&local_ec);
  local_188._M_dataplus._M_p = local_188._M_dataplus._M_p & 0xffffffff00000000;
  local_ec = 0;
  std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>::
  emplace_back<char_const(&)[35],cmListFileArgument::Delimiter,int>
            ((vector<cmListFileArgument,std::allocator<cmListFileArgument>> *)&local_108,
             (char (*) [35])"__CMAKE_INJECTED_PROJECT_COMMAND__",(Delimiter *)&local_188,&local_ec);
  std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::insert
            (&local_a8.Functions,
             (const_iterator)
             local_a8.Functions.
             super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
             super__Vector_impl_data._M_start,(value_type *)local_168);
  std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::~vector
            ((vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)&local_108);
  if ((cmLinkedTree<cmStateDetail::SnapshotDataType> *)local_158._16_8_ != &local_138) {
    operator_delete((void *)local_158._16_8_,
                    CONCAT71(local_138.Data.
                             super__Vector_base<cmStateDetail::SnapshotDataType,_std::allocator<cmStateDetail::SnapshotDataType>_>
                             ._M_impl.super__Vector_impl_data._M_start._1_7_,
                             local_138.Data.
                             super__Vector_base<cmStateDetail::SnapshotDataType,_std::allocator<cmStateDetail::SnapshotDataType>_>
                             ._M_impl.super__Vector_impl_data._M_start._0_1_) + 1);
  }
  if ((element_type *)local_168._0_8_ != (element_type *)local_158) {
    operator_delete((void *)local_168._0_8_,
                    (ulong)&(((map<cmProperty::ScopeType,_cmPropertyDefinitionMap,_std::less<cmProperty::ScopeType>,_std::allocator<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>_>
                               *)local_158._0_8_)->_M_t)._M_impl.field_0x1);
  }
  goto LAB_001cba83;
}

Assistant:

void cmMakefile::Configure()
{
  std::string currentStart =
    this->StateSnapshot.GetDirectory().GetCurrentSource();
  currentStart += "/CMakeLists.txt";

  // Add the bottom of all backtraces within this directory.
  // We will never pop this scope because it should be available
  // for messages during the generate step too.
  this->Backtrace = this->Backtrace.Push(currentStart);

  BuildsystemFileScope scope(this);

  // make sure the CMakeFiles dir is there
  std::string filesDir = this->StateSnapshot.GetDirectory().GetCurrentBinary();
  filesDir += "/CMakeFiles";
  cmSystemTools::MakeDirectory(filesDir);

  assert(cmSystemTools::FileExists(currentStart, true));
  this->AddDefinition("CMAKE_PARENT_LIST_FILE", currentStart.c_str());

  cmListFile listFile;
  if (!listFile.ParseFile(currentStart.c_str(), this->GetMessenger(),
                          this->Backtrace)) {
    return;
  }
  if (this->IsRootMakefile()) {
    bool hasVersion = false;
    // search for the right policy command
    for (cmListFileFunction const& func : listFile.Functions) {
      if (func.Name.Lower == "cmake_minimum_required") {
        hasVersion = true;
        break;
      }
    }
    // if no policy command is found this is an error if they use any
    // non advanced functions or a lot of functions
    if (!hasVersion) {
      bool isProblem = true;
      if (listFile.Functions.size() < 30) {
        // the list of simple commands DO NOT ADD TO THIS LIST!!!!!
        // these commands must have backwards compatibility forever and
        // and that is a lot longer than your tiny mind can comprehend mortal
        std::set<std::string> allowedCommands;
        allowedCommands.insert("project");
        allowedCommands.insert("set");
        allowedCommands.insert("if");
        allowedCommands.insert("endif");
        allowedCommands.insert("else");
        allowedCommands.insert("elseif");
        allowedCommands.insert("add_executable");
        allowedCommands.insert("add_library");
        allowedCommands.insert("target_link_libraries");
        allowedCommands.insert("option");
        allowedCommands.insert("message");
        isProblem = false;
        for (cmListFileFunction const& func : listFile.Functions) {
          if (allowedCommands.find(func.Name.Lower) == allowedCommands.end()) {
            isProblem = true;
            break;
          }
        }
      }

      if (isProblem) {
        // Tell the top level cmMakefile to diagnose
        // this violation of CMP0000.
        this->SetCheckCMP0000(true);

        // Implicitly set the version for the user.
        this->SetPolicyVersion("2.4", std::string());
      }
    }
    bool hasProject = false;
    // search for a project command
    for (cmListFileFunction const& func : listFile.Functions) {
      if (func.Name.Lower == "project") {
        hasProject = true;
        break;
      }
    }
    // if no project command is found, add one
    if (!hasProject) {
      this->GetCMakeInstance()->IssueMessage(
        MessageType::AUTHOR_WARNING,
        "No project() command is present.  The top-level CMakeLists.txt "
        "file must contain a literal, direct call to the project() command.  "
        "Add a line of code such as\n"
        "  project(ProjectName)\n"
        "near the top of the file, but after cmake_minimum_required().\n"
        "CMake is pretending there is a \"project(Project)\" command on "
        "the first line.",
        this->Backtrace);
      cmListFileFunction project;
      project.Name.Lower = "project";
      project.Arguments.emplace_back("Project", cmListFileArgument::Unquoted,
                                     0);
      project.Arguments.emplace_back("__CMAKE_INJECTED_PROJECT_COMMAND__",
                                     cmListFileArgument::Unquoted, 0);
      listFile.Functions.insert(listFile.Functions.begin(), project);
    }
  }

  this->ReadListFile(listFile, currentStart);
  if (cmSystemTools::GetFatalErrorOccured()) {
    scope.Quiet();
  }

  // at the end handle any old style subdirs
  std::vector<cmMakefile*> subdirs = this->UnConfiguredDirectories;

  // for each subdir recurse
  std::vector<cmMakefile*>::iterator sdi = subdirs.begin();
  for (; sdi != subdirs.end(); ++sdi) {
    (*sdi)->StateSnapshot.InitializeFromParent_ForSubdirsCommand();
    this->ConfigureSubDirectory(*sdi);
  }

  this->AddCMakeDependFilesFromUser();
}